

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  FieldDescriptor *in_RAX;
  Descriptor *d_00;
  int iVar1;
  FieldDescriptor *local_28;
  
  local_28 = in_RAX;
  if (0 < *(int *)(d + 0x80)) {
    iVar1 = 0;
    do {
      d_00 = Descriptor::nested_type(d,iVar1);
      ListAllFields(d_00,fields);
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)(d + 0x80));
  }
  if (0 < *(int *)(d + 0x8c)) {
    iVar1 = 0;
    do {
      local_28 = Descriptor::extension(d,iVar1);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)fields,&local_28);
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)(d + 0x8c));
  }
  if (0 < *(int *)(d + 4)) {
    iVar1 = 0;
    do {
      local_28 = Descriptor::field(d,iVar1);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)fields,&local_28);
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)(d + 4));
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}